

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

void SEM_CompSt(ast *node,field_t *f)

{
  int iVar1;
  attr *a;
  ast *paVar2;
  ast *node_00;
  char *s;
  
  if (f != (field_t *)0x0) {
    do {
      a = f->type;
      if (a->kind == 2) {
        a = findvar(((a->field_1).basic)->name);
        if (a != (attr *)0x0) {
          s = f->name;
          goto LAB_00107aa6;
        }
        semerror(0x11,node->pos->first_line,semErrorMsg[0x11],*_DAT_00000008);
      }
      else {
        s = f->name;
LAB_00107aa6:
        insertvar(s,a);
      }
      f = f->next;
    } while (f != (field_t *)0x0);
  }
  paVar2 = child(node,2);
  SEM_DefList(paVar2,1);
  paVar2 = child(node,3);
  iVar1 = paVar2->type;
  while (iVar1 != -1) {
    node_00 = child(paVar2,1);
    SEM_Stmt(node_00);
    paVar2 = child(paVar2,2);
    iVar1 = paVar2->type;
  }
  return;
}

Assistant:

static void SEM_CompSt(struct ast *node, struct field_t *f) {
#if COMPILER_VERSION < 3
    newenv();
#endif
    for (; f; f = f->next) {
        struct attr *a = f->type;
        if (a->kind == STRUCTURE) {
            a = findvar(a->structure->name);
            if (a == NULL) {
                SEMERROR(UndefinedStruct, node, a->structure->name);
            } else
                insertvar(f->name, a);
        } else
            insertvar(f->name, f->type);
    }
    SEM_DefList(child(node, 2), 1);
    SEM_StmtList(child(node ,3));
#if COMPILER_VERSION < 3
    deleteenv();
#endif
}